

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::LossParameter::MergePartialFromCodedStream(LossParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  unsigned_long uVar8;
  int64 iVar9;
  UnknownFieldSet *pUVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  pair<unsigned_long,_bool> pVar14;
  
  this_00 = &this->_internal_metadata_;
LAB_003ad8c6:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003ad8ea;
      input->buffer_ = pbVar2 + 1;
      uVar13 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003ad8ea:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar13 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar6 | uVar13;
    }
    uVar12 = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto LAB_003ad90c;
    uVar7 = (uint)(uVar13 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar13;
    if (uVar7 == 3) {
      if (cVar11 != '\x18') goto LAB_003ad90c;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar6 = (uint32)bVar1;
        uVar12 = (uint)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003ada0b;
        input->buffer_ = pbVar2 + 1;
      }
      else {
        uVar6 = 0;
LAB_003ada0b:
        iVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        uVar12 = (uint)iVar9;
        if (iVar9 < 0) {
          return false;
        }
      }
      if (uVar12 < 4) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        this->normalization_ = uVar12;
      }
      else {
        pvVar3 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          pUVar10 = google::protobuf::internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_00->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar10 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        google::protobuf::UnknownFieldSet::AddVarint(pUVar10,3,(long)(int)uVar12);
      }
      goto LAB_003ad8c6;
    }
    if (uVar7 == 2) {
      if (cVar11 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar4, -1 < (long)uVar8)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar14.first;
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->normalize_ = uVar8 != 0;
        goto LAB_003ad8c6;
      }
    }
    else if ((uVar7 == 1) && (cVar11 == '\b')) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar13 = (ulong)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003ada50;
        input->buffer_ = pbVar2 + 1;
      }
      else {
        uVar6 = 0;
LAB_003ada50:
        uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        if ((long)uVar13 < 0) {
          return false;
        }
      }
      this->ignore_label_ = (int32)uVar13;
      goto LAB_003ad8c6;
    }
LAB_003ad90c:
    if (uVar12 == 0) {
      return true;
    }
    if ((uVar12 & 7) == 4) {
      return true;
    }
    pvVar3 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      pUVar10 = google::protobuf::internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_00->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar10 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    bVar5 = google::protobuf::internal::WireFormat::SkipField(input,uVar12,pUVar10);
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool LossParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.LossParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 ignore_label = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_ignore_label();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &ignore_label_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool normalize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_normalize();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &normalize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LossParameter.NormalizationMode normalization = 3 [default = VALID];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::LossParameter_NormalizationMode_IsValid(value)) {
            set_normalization(static_cast< ::caffe::LossParameter_NormalizationMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(3, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.LossParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.LossParameter)
  return false;
#undef DO_
}